

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::isEdgeTriplet(RGBA *c1,RGBA *c2,RGBA *c3,IVec3 *renderTargetThreshold)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool local_36;
  bool local_35;
  bool local_34;
  bool b3;
  bool b2;
  bool b1;
  IVec3 *renderTargetThreshold_local;
  RGBA *c3_local;
  RGBA *c2_local;
  RGBA *c1_local;
  
  bVar1 = isBlack(c1);
  bVar2 = isBlack(c2);
  bVar3 = isBlack(c3);
  local_34 = false;
  if ((bVar1) && (local_34 = false, bVar2)) {
    local_34 = bVar3;
  }
  if (local_34 == false) {
    local_35 = true;
    if ((!bVar1) && (local_35 = true, !bVar2)) {
      local_35 = bVar3;
    }
    if (local_35 == true) {
      return true;
    }
  }
  if (((bVar1) && (bVar2)) && (bVar3)) {
    c1_local._7_1_ = false;
  }
  else {
    iVar4 = tcu::RGBA::getRed(c1);
    iVar5 = tcu::RGBA::getRed(c2);
    iVar6 = tcu::RGBA::getRed(c3);
    iVar7 = tcu::Vector<int,_3>::x(renderTargetThreshold);
    bVar1 = isEdgeTripletComponent(iVar4,iVar5,iVar6,iVar7);
    local_36 = true;
    if (!bVar1) {
      iVar4 = tcu::RGBA::getGreen(c1);
      iVar5 = tcu::RGBA::getGreen(c2);
      iVar6 = tcu::RGBA::getGreen(c3);
      iVar7 = tcu::Vector<int,_3>::y(renderTargetThreshold);
      bVar1 = isEdgeTripletComponent(iVar4,iVar5,iVar6,iVar7);
      local_36 = true;
      if (!bVar1) {
        iVar4 = tcu::RGBA::getBlue(c1);
        iVar5 = tcu::RGBA::getBlue(c2);
        iVar6 = tcu::RGBA::getBlue(c3);
        iVar7 = tcu::Vector<int,_3>::z(renderTargetThreshold);
        local_36 = isEdgeTripletComponent(iVar4,iVar5,iVar6,iVar7);
      }
    }
    c1_local._7_1_ = local_36;
  }
  return c1_local._7_1_;
}

Assistant:

static bool isEdgeTriplet (const tcu::RGBA& c1, const tcu::RGBA& c2, const tcu::RGBA& c3, const tcu::IVec3& renderTargetThreshold)
{
	// black (background color) and non-black is always an edge
	{
		const bool b1 = isBlack(c1);
		const bool b2 = isBlack(c2);
		const bool b3 = isBlack(c3);

		// both pixels with coverage and pixels without coverage
		if ((b1 && b2 && b3) == false && (b1 || b2 || b3) == true)
			return true;
		// all black
		if (b1 && b2 && b3)
			return false;
		// all with coverage
		DE_ASSERT(!b1 && !b2 && !b3);
	}

	// Color is always linearly interpolated => component values change nearly linearly
	// in any constant direction on triangle hull. (df/dx ~= C).

	// Edge detection (this function) is run against the reference image
	// => no dithering to worry about

	return	isEdgeTripletComponent(c1.getRed(),		c2.getRed(),	c3.getRed(),	renderTargetThreshold.x())	||
			isEdgeTripletComponent(c1.getGreen(),	c2.getGreen(),	c3.getGreen(),	renderTargetThreshold.y())	||
			isEdgeTripletComponent(c1.getBlue(),	c2.getBlue(),	c3.getBlue(),	renderTargetThreshold.z());
}